

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_zeroing<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  node_ptr plVar3;
  node_ptr plVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pool<boost::default_user_allocator_malloc_free> *ppVar13;
  pointer p;
  _Hash_node_base *p_Var14;
  ulong uVar15;
  pointer p_1;
  pointer p_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>
  m;
  shared_count sStack_370;
  char *local_368;
  char *local_360;
  undefined **local_358;
  undefined1 local_350;
  undefined8 *local_348;
  char **local_340;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_338;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  pool<boost::default_user_allocator_malloc_free> *local_200;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>
  local_1f8;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>>
            ();
  local_200 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_200->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_200->list).ptr = (char *)0x0;
  (local_200->list).sz = 0;
  local_200->requested_size = 0x18;
  local_200->next_size = 0x20;
  local_200->start_size = 0x20;
  local_200->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
              *)&local_1f8,&local_338,(Column_settings *)local_200);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x26d);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar5,0);
  if (local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var14 = p_Var2 + 5;
        goto LAB_00168cd7;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var14 == (_Hash_node_base *)0x0) goto LAB_00169474;
    if (*(int *)&p_Var14[2]._M_nxt == 1) break;
LAB_00168cd7:
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == p_Var2 + 5) break;
  }
  sStack_370.pi_ = (sp_counted_base *)0x0;
  local_368 = "!m.is_zero_entry(3, 1)";
  local_360 = "";
  local_350 = 0;
  local_358 = &PTR__lazy_ostream_00257fe8;
  local_348 = &boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  local_340 = &local_368;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_370);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x26e);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_370.pi_ = (sp_counted_base *)0x0;
        local_368 = "!m.is_zero_column(3)";
        local_360 = "";
        local_350 = 0;
        local_358 = &PTR__lazy_ostream_00257fe8;
        local_348 = &boost::unit_test::lazy_ostream::inst;
        local_260 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_258 = "";
        local_340 = &local_368;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_370);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
        uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
        if (local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_00169468;
        p_Var2 = local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x00168ec5;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_00 == (pointer)0x0) goto LAB_00169474;
    if (p_00->rowIndex_ == 1) break;
LAB_00168ef3:
    p_00 = (pointer)(p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p_00 == (pointer)(p_Var2 + 5)) goto LAB_00168f27;
  }
  plVar3 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar4 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar4->next_ = plVar3;
  plVar3->prev_ = plVar4;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>_>
  ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>_>
             *)p_Var2[4]._M_nxt,p_00);
LAB_00168f27:
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_270,0x270);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
  if (local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var14 = p_Var2 + 5;
        goto LAB_00168fb7;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var14 == (_Hash_node_base *)0x0) goto LAB_00169474;
    if (*(int *)&p_Var14[2]._M_nxt == 1) break;
LAB_00168fb7:
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == p_Var2 + 5) break;
  }
  sStack_370.pi_ = (sp_counted_base *)0x0;
  local_368 = "m.is_zero_entry(3, 1)";
  local_360 = "";
  local_350 = 0;
  local_358 = &PTR__lazy_ostream_00257fe8;
  local_348 = &boost::unit_test::lazy_ostream::inst;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_288 = "";
  local_340 = &local_368;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_370);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x271);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
  if (local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_370.pi_ = (sp_counted_base *)0x0;
        local_368 = "!m.is_zero_column(3)";
        local_360 = "";
        local_350 = 0;
        local_358 = &PTR__lazy_ostream_00257fe8;
        local_348 = &boost::unit_test::lazy_ostream::inst;
        local_2c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_2b8 = "";
        local_340 = &local_368;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_370);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
        uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar10,0);
        if (local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_00169468;
        p_Var2 = local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x001691a2;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15))) {
joined_r0x00168ec5:
    if (uVar1 == 3) {
      p_00 = (pointer)(p_Var2 + 5);
      goto LAB_00168ef3;
    }
  }
LAB_00169468:
  std::__throw_out_of_range("_Map_base::at");
joined_r0x001691a2:
  if (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
       (ulong)uVar1 % local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar15))
    goto LAB_00169468;
    goto joined_r0x001691a2;
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)(p_Var2 + 5),
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>
              *)(p_Var2 + 2));
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d0,0x273);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
  if (local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] == (__node_base_ptr)0x0
     ) goto LAB_001694c3;
  p_Var2 = local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
  while (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
       (ulong)uVar1 % local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar15)) {
LAB_001694c3:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  p_Var14 = p_Var2 + 5;
  do {
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == p_Var2 + 5) break;
    if (p_Var14 == (_Hash_node_base *)0x0) {
LAB_00169474:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (*(int *)&p_Var14[2]._M_nxt != 1);
  sStack_370.pi_ = (sp_counted_base *)0x0;
  local_368 = "m.is_zero_entry(3, 1)";
  local_360 = "";
  local_350 = 0;
  local_358 = &PTR__lazy_ostream_00257fe8;
  local_348 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_340 = &local_368;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_370);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_300,0x274);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar12,0);
  if (local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var2 = local_1f8.reducedMatrixR_.matrix_._M_h._M_buckets[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_370.pi_ = (sp_counted_base *)0x0;
        local_368 = "m.is_zero_column(3)";
        local_360 = "";
        local_350 = 0;
        local_358 = &PTR__lazy_ostream_00257fe8;
        local_348 = &boost::unit_test::lazy_ostream::inst;
        local_320 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_318 = "";
        local_340 = &local_368;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_370);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>
        ::reset(&local_1f8,(Column_settings *)local_200);
        ppVar13 = local_200;
        if (local_200 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_200);
        }
        operator_delete(ppVar13,0x38);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>
        ::~RU_matrix(&local_1f8);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_338);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1f8.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}